

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

PackedSlice * __thiscall kratos::VarSlice::operator[](VarSlice *this,string *member_name)

{
  PackedStructFieldDef *pPVar1;
  char cVar2;
  int iVar3;
  uint32_t uVar4;
  undefined4 extraout_var;
  PackedSlice *pPVar5;
  long *plVar6;
  InternalException *this_00;
  UserException *pUVar7;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  PackedStructFieldDef *local_90;
  PackedStructFieldDef *def;
  shared_ptr<kratos::PackedSlice> p;
  string local_60;
  PackedStructFieldDef *local_40;
  element_type *peStack_38;
  
  if (this->parent_var == (Var *)0x0) {
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    def = (PackedStructFieldDef *)
          &p.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::__cxx11::string::_M_construct<char_const*>((string *)&def,"Invalid var slice","");
    InternalException::InternalException(this_00,(string *)&def);
    __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar3 = (*(this->parent_var->super_IRNode)._vptr_IRNode[0x18])();
  if ((char)iVar3 != '\0') {
    uVar4 = (*(this->super_Var).super_IRNode._vptr_IRNode[7])(this);
    if (uVar4 == (this->super_Var).var_width_) {
      iVar3 = (*(this->super_Var).super_IRNode._vptr_IRNode[0x29])(this);
      plVar6 = (long *)CONCAT44(extraout_var,iVar3);
      cVar2 = (**(code **)(*plVar6 + 0xb8))(plVar6);
      if (cVar2 == '\0') {
        pUVar7 = (UserException *)__cxa_allocate_exception(0x10);
        (*(this->super_Var).super_IRNode._vptr_IRNode[0x1f])(&local_40,this);
        p.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(member_name->_M_dataplus)._M_p;
        def = local_40;
        p.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peStack_38;
        format_str_00.size_ = 0xdd;
        format_str_00.data_ = (char *)0x1c;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)&def;
        fmt::v7::detail::vformat_abi_cxx11_
                  (&local_60,(detail *)"Invalid member access{0}.{1}",format_str_00,args_00);
        UserException::UserException(pUVar7,&local_60);
        __cxa_throw(pUVar7,&UserException::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar3 = (*(this->super_Var).super_IRNode._vptr_IRNode[0x17])(this);
      if ((char)iVar3 != '\0') {
        pPVar5 = (PackedSlice *)__dynamic_cast(this,&typeinfo,&PackedSlice::typeinfo,0);
        pPVar5 = PackedSlice::slice_member(pPVar5,member_name);
        return pPVar5;
      }
      plVar6 = (long *)__dynamic_cast(plVar6,&Var::typeinfo,&PackedInterface::typeinfo,
                                      0xfffffffffffffffe);
      if (plVar6 == (long *)0x0) {
        pUVar7 = (UserException *)__cxa_allocate_exception(0x10);
        (*(this->super_Var).super_IRNode._vptr_IRNode[0x1f])(&local_40,this);
        p.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(member_name->_M_dataplus)._M_p;
        def = local_40;
        p.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peStack_38;
        format_str_01.size_ = 0xdd;
        format_str_01.data_ = (char *)0x18;
        args_01.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args_01.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)&def;
        fmt::v7::detail::vformat_abi_cxx11_
                  (&local_60,(detail *)"Unable to access {0}.{1}",format_str_01,args_01);
        UserException::UserException(pUVar7,&local_60);
        __cxa_throw(pUVar7,&UserException::typeinfo,std::runtime_error::~runtime_error);
      }
      local_90 = (PackedStructFieldDef *)(**(code **)(*plVar6 + 8))(plVar6,member_name);
      if (local_90 != (PackedStructFieldDef *)0x0) {
        def = (PackedStructFieldDef *)0x0;
        local_60._M_dataplus._M_p = (pointer)this;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<kratos::PackedSlice,std::allocator<kratos::PackedSlice>,kratos::VarSlice*,kratos::PackedStructFieldDef_const*&,std::__cxx11::string_const&>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p,(PackedSlice **)&def,
                   (allocator<kratos::PackedSlice> *)&local_40,(VarSlice **)&local_60,&local_90,
                   member_name);
        std::__shared_ptr<kratos::PackedSlice,(__gnu_cxx::_Lock_policy)2>::
        _M_enable_shared_from_this_with<kratos::PackedSlice,kratos::PackedSlice>
                  ((__shared_ptr<kratos::PackedSlice,(__gnu_cxx::_Lock_policy)2> *)&def,
                   (PackedSlice *)def);
        std::
        vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
        ::emplace_back<std::shared_ptr<kratos::PackedSlice>&>
                  ((vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
                    *)&(this->super_Var).slices_,(shared_ptr<kratos::PackedSlice> *)&def);
        pPVar1 = def;
        if (p.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     p.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
        return (PackedSlice *)pPVar1;
      }
      pUVar7 = (UserException *)__cxa_allocate_exception(0x10);
      (*(this->super_Var).super_IRNode._vptr_IRNode[0x1f])(&local_40,this);
      p.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(member_name->_M_dataplus)._M_p;
      def = local_40;
      p.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peStack_38;
      format_str_02.size_ = 0xdd;
      format_str_02.data_ = (char *)0x18;
      args_02.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args_02.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&def;
      fmt::v7::detail::vformat_abi_cxx11_
                (&local_60,(detail *)"Unable to access {0}.{1}",format_str_02,args_02);
      UserException::UserException(pUVar7,&local_60);
      __cxa_throw(pUVar7,&UserException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  pUVar7 = (UserException *)__cxa_allocate_exception(0x10);
  (*(this->super_Var).super_IRNode._vptr_IRNode[0x1f])(&local_40,this);
  p.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(member_name->_M_dataplus)._M_p;
  def = local_40;
  p.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peStack_38;
  format_str.size_ = 0xdd;
  format_str.data_ = (char *)0x18;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&def;
  fmt::v7::detail::vformat_abi_cxx11_
            (&local_60,(detail *)"Unable to access {0}.{1}",format_str,args);
  UserException::UserException(pUVar7,&local_60);
  __cxa_throw(pUVar7,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

PackedSlice &VarSlice::operator[](const std::string &member_name) {
    if (!parent_var) throw InternalException("Invalid var slice");
    if (!parent_var->is_packed() || width() != var_width())
        throw UserException(::format("Unable to access {0}.{1}", to_string(), member_name));
    auto *root = get_var_root_parent();
    if (!root->is_struct())
        throw UserException(::format("Invalid member access{0}.{1}", to_string(), member_name));
    const PackedStructFieldDef *def;
    if (is_struct()) {
        auto *packed = dynamic_cast<PackedSlice *>(this);
        return packed->slice_member(member_name);
    } else {
        auto *packed = dynamic_cast<PackedInterface *>(root);
        if (!packed)
            throw UserException(::format("Unable to access {0}.{1}", to_string(), member_name));
        def = packed->get_definition(member_name);
    }

    if (!def) throw UserException(::format("Unable to access {0}.{1}", to_string(), member_name));
    auto p = std::make_shared<PackedSlice>(this, def, member_name);
    slices_.emplace_back(p);
    return *p;
}